

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.h
# Opt level: O1

Expression __thiscall dynet::RNNBuilder::add_input(RNNBuilder *this,Expression *x)

{
  uint uVar1;
  iterator __position;
  undefined8 extraout_RDX;
  Expression EVar2;
  
  RNNStateMachine::transition((RNNStateMachine *)(x + 1),add_input);
  __position._M_current = (RNNPointer *)x[2].pg;
  if (__position._M_current == *(RNNPointer **)&x[2].i) {
    std::vector<dynet::RNNPointer,std::allocator<dynet::RNNPointer>>::
    _M_realloc_insert<dynet::RNNPointer_const&>
              ((vector<dynet::RNNPointer,std::allocator<dynet::RNNPointer>> *)&x[1].i,__position,
               (RNNPointer *)&x->i);
  }
  else {
    (__position._M_current)->t = (x->i).t;
    x[2].pg = (ComputationGraph *)(__position._M_current + 1);
  }
  uVar1 = (x->i).t;
  (x->i).t = (int)((ulong)((long)x[2].pg - *(long *)&x[1].i) >> 2) - 1;
  (**(code **)(x->pg + 0x68))(this,x,uVar1);
  EVar2._8_8_ = extraout_RDX;
  EVar2.pg = (ComputationGraph *)this;
  return EVar2;
}

Assistant:

Expression add_input(const Expression& x) {
    sm.transition(RNNOp::add_input);
    head.push_back(cur);
    int rcp = cur;
    cur = head.size() - 1;
    return add_input_impl(rcp, x);
  }